

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O0

shared_ptr<mocker::nasm::Addr> __thiscall
mocker::anon_unknown_0::FuncSelectionContext::getIrAddr
          (FuncSelectionContext *this,shared_ptr<mocker::ir::Addr> *addr)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  string *__lhs;
  shared_ptr<mocker::nasm::Register> *__r;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<mocker::nasm::Addr> sVar3;
  shared_ptr<mocker::nasm::NumericConstant> local_78;
  undefined1 local_68 [8];
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::nasm::NumericConstant> local_40;
  undefined1 local_30 [8];
  shared_ptr<mocker::ir::IntLiteral> p;
  shared_ptr<mocker::ir::Addr> *addr_local;
  FuncSelectionContext *this_local;
  
  p.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX;
  ir::dyc<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
            ((ir *)local_30,(shared_ptr<mocker::ir::Addr> *)in_RDX);
  reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
       std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_) {
    this_00 = std::
              __shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_30);
    ir::IntLiteral::getVal(this_00);
    std::make_shared<mocker::nasm::NumericConstant,long>((long *)&local_40);
    std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::NumericConstant,void>
              ((shared_ptr<mocker::nasm::Addr> *)this,&local_40);
    std::shared_ptr<mocker::nasm::NumericConstant>::~shared_ptr(&local_40);
  }
  reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._1_3_ = 0;
  std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr
            ((shared_ptr<mocker::ir::IntLiteral> *)local_30);
  _Var2._M_pi = extraout_RDX;
  if ((uint)reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      0) {
    ir::dyc<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
              ((ir *)local_68,
               (shared_ptr<mocker::ir::Addr> *)
               p.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    this_01 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_68);
    __lhs = ir::Reg::getIdentifier_abi_cxx11_(this_01);
    bVar1 = std::operator==(__lhs,".phi_nan");
    if (bVar1) {
      std::make_shared<mocker::nasm::NumericConstant,int>((int *)&local_78);
      std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::NumericConstant,void>
                ((shared_ptr<mocker::nasm::Addr> *)this,&local_78);
      std::shared_ptr<mocker::nasm::NumericConstant>::~shared_ptr(&local_78);
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
      if (!bVar1) {
        __assert_fail("reg",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                      ,0x45,
                      "std::shared_ptr<nasm::Addr> mocker::(anonymous namespace)::FuncSelectionContext::getIrAddr(const std::shared_ptr<ir::Addr> &) const"
                     );
      }
      __r = VRegAssignment::getVReg((VRegAssignment *)addr,(shared_ptr<mocker::ir::Reg> *)local_68);
      std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                ((shared_ptr<mocker::nasm::Addr> *)this,__r);
    }
    reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_68);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Addr>)
         sVar3.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<nasm::Addr>
  getIrAddr(const std::shared_ptr<ir::Addr> &addr) const {
    if (auto p = ir::dyc<ir::IntLiteral>(addr)) {
      return std::make_shared<nasm::NumericConstant>(p->getVal());
    }
    auto reg = ir::dyc<ir::Reg>(addr);
    if (reg->getIdentifier() == ".phi_nan")
      return std::make_shared<nasm::NumericConstant>(0);
    assert(reg);
    return irRegAddr.getVReg(reg);
  }